

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::init
          (SwapBuffersWithDamageTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  EGLConfig pvVar1;
  NativeDisplay *pNVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  GLenum err;
  int extraout_EAX;
  Library *pLVar8;
  EGLDisplay pvVar9;
  undefined4 extraout_var;
  NativeWindowFactory *pNVar10;
  undefined4 extraout_var_00;
  EGLSurface pvVar11;
  undefined4 extraout_var_01;
  GLES2Renderer *pGVar12;
  pointer pcVar13;
  TestError *this_00;
  long lVar14;
  size_type __dnew;
  size_type __dnew_1;
  value_type local_150;
  value_type local_130;
  Functions *local_110;
  size_type local_108;
  ProgramSources local_100;
  
  pLVar8 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar9 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar9;
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,pLVar8,pvVar9);
  this->m_eglConfig = (EGLConfig)CONCAT44(extraout_var,iVar5);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,pLVar8,this->m_eglDisplay);
  pvVar1 = this->m_eglConfig;
  pNVar10 = eglu::selectNativeWindowFactory
                      (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  pvVar9 = this->m_eglDisplay;
  pNVar2 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       eglu::parseWindowVisibility
                 (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1e0000001e0;
  iVar5 = (*(pNVar10->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar10,pNVar2,pvVar9,pvVar1,0,&local_100);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var_00,iVar5);
  pvVar11 = eglu::createWindowSurface
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var_00,iVar5),
                       this->m_eglDisplay,pvVar1,(EGLAttrib *)0x0);
  this->m_eglSurface = pvVar11;
  pvVar1 = this->m_eglConfig;
  pLVar8 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200003098;
  local_100.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3038;
  (**pLVar8->_vptr_Library)(pLVar8,0x30a0);
  iVar5 = (*pLVar8->_vptr_Library[6])(pLVar8,this->m_eglDisplay,pvVar1,0,&local_100);
  this->m_eglContext = (EGLContext)CONCAT44(extraout_var_01,iVar5);
  dVar6 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
  eglu::checkError(dVar6,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                   ,0x184);
  pvVar11 = this->m_eglSurface;
  if (pvVar11 != (EGLSurface)0x0) {
    (*pLVar8->_vptr_Library[0x27])(pLVar8,this->m_eglDisplay,pvVar11,pvVar11,this->m_eglContext);
    dVar6 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
    eglu::checkError(dVar6,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x187);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pGVar12 = (GLES2Renderer *)operator_new(0xe0);
    pGVar12->m_gl = dst;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_150._M_dataplus._M_p = (pointer)0xa9;
    local_110 = dst;
    pcVar13 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_150);
    _Var3._M_p = local_150._M_dataplus._M_p;
    local_130.field_2._M_allocated_capacity = (size_type)local_150._M_dataplus._M_p;
    local_130._M_dataplus._M_p = pcVar13;
    memcpy(pcVar13,
           "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
           ,0xa9);
    local_130._M_string_length = (size_type)_Var3._M_p;
    pcVar13[_Var3._M_p] = '\0';
    local_108 = 0x4a;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    pcVar13 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_108);
    sVar4 = local_108;
    local_150.field_2._M_allocated_capacity = local_108;
    local_150._M_dataplus._M_p = pcVar13;
    memcpy(pcVar13,"varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}"
           ,0x4a);
    local_150._M_string_length = sVar4;
    pcVar13[sVar4] = '\0';
    memset(&local_100,0,0xac);
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources,&local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + 1,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
    glu::ShaderProgram::ShaderProgram(&pGVar12->m_glProgram,local_110,&local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar14 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar14));
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != -0x18);
    pGVar12->m_coordLoc = 0xffffffff;
    pGVar12->m_colorLoc = 0xffffffff;
    GVar7 = (*pGVar12->m_gl->getAttribLocation)
                      ((pGVar12->m_glProgram).m_program.m_program,"a_color");
    pGVar12->m_colorLoc = GVar7;
    GVar7 = (*pGVar12->m_gl->getAttribLocation)((pGVar12->m_glProgram).m_program.m_program,"a_pos");
    pGVar12->m_coordLoc = GVar7;
    err = (*pGVar12->m_gl->getError)();
    glu::checkError(err,"Failed to get attribute locations",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                    ,0xb5);
    this->m_gles2Renderer = pGVar12;
    return extraout_EAX;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_eglSurface != EGL_NO_SURFACE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
             ,0x185);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SwapBuffersWithDamageTest::init (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	m_eglDisplay = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig  = getConfig(egl, m_eglDisplay);

	checkExtension(egl, m_eglDisplay);

	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));
	m_gles2Renderer = new GLES2Renderer(m_gl);
}